

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_a<ncnn::BinaryOp_x86_avx_functor::binary_op_atan2>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [32];
  float *in_RDI;
  int in_R8D;
  float fVar44;
  undefined1 auVar45 [32];
  __m128 _outp_1;
  __m128 _b_1;
  __m256 _outp;
  __m256 _b;
  __m256 _a_256;
  __m128 _a_128;
  int i;
  float a;
  binary_op_atan2 op;
  __m256 special_result;
  __m256 negative_mask_full_x;
  __m256 normal_result;
  __m256 pi_additions;
  __m256 negative_mask_y;
  __m256 negative_mask_x;
  __m256 normal_mode;
  __m256 not_equal_zero_y;
  __m256 not_equal_zero_x;
  __m256 magic_half_pi;
  __m256 magic_pi;
  __m256 magic_negative_zero;
  __m256 magic_zero;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi_1;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero_1;
  __m128 special_result_1;
  __m128 negative_mask_full_x_1;
  __m128 normal_result_1;
  __m128 pi_additions_1;
  __m128 negative_mask_y_1;
  __m128 negative_mask_x_1;
  __m128 normal_mode_1;
  __m128 not_equal_zero_y_1;
  __m128 not_equal_zero_x_1;
  __m128 magic_half_pi_2;
  __m128 magic_pi_1;
  __m128 magic_negative_zero_2;
  __m128 magic_zero_1;
  __m128 output_approx_1;
  __m128 fourth_power_of_input_approx_1;
  __m128 square_of_input_approx_1;
  __m128 input_approx_1;
  __m128 is_small_input_1;
  __m128 absolute_1;
  __m128 negative_mask_1;
  __m128 magic_a8_1;
  __m128 magic_a7_1;
  __m128 magic_a6_1;
  __m128 magic_a5_1;
  __m128 magic_a4_1;
  __m128 magic_a3_1;
  __m128 magic_a2_1;
  __m128 magic_a1_1;
  __m128 magic_a0_1;
  __m128 magic_half_pi_3;
  __m128 magic_negative_one_1;
  __m128 magic_one_1;
  __m128 magic_negative_zero_3;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 local_2650;
  undefined8 uStack_2648;
  undefined1 local_2640 [32];
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25d0;
  undefined8 uStack_25c8;
  int local_25bc;
  float local_25b8;
  undefined1 local_25b1 [5];
  int local_25ac;
  float *local_25a8;
  undefined1 (*local_25a0) [32];
  undefined1 (*local_2590) [32];
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  float *local_2558;
  undefined1 (*local_2550) [32];
  undefined8 local_2540;
  undefined8 uStack_2538;
  float *local_2528;
  float local_2520;
  float fStack_251c;
  float fStack_2518;
  float fStack_2514;
  float local_2504;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 *local_24e8;
  undefined8 *local_24e0;
  undefined1 *local_24d8;
  undefined8 *local_24d0;
  undefined8 *local_24c8;
  undefined1 *local_24c0;
  undefined1 (*local_24b8) [32];
  float *local_24b0;
  undefined1 *local_24a8;
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  undefined1 local_23a0 [32];
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined1 local_22a0 [8];
  float fStack_2298;
  float fStack_2294;
  float fStack_2290;
  float fStack_228c;
  float fStack_2288;
  float fStack_2284;
  undefined4 local_2270;
  undefined4 local_226c;
  undefined4 local_2268;
  undefined4 local_2264;
  undefined1 local_2260 [16];
  undefined1 auStack_2250 [16];
  undefined4 local_2240;
  undefined4 local_223c;
  undefined4 local_2238;
  undefined4 local_2234;
  undefined4 local_2230;
  undefined4 local_222c;
  undefined4 local_2228;
  undefined4 local_2224;
  undefined1 local_2220 [16];
  undefined1 auStack_2210 [16];
  undefined4 local_2200;
  undefined4 local_21fc;
  undefined4 local_21f8;
  undefined4 local_21f4;
  undefined4 local_21f0;
  undefined4 local_21ec;
  undefined4 local_21e8;
  undefined4 local_21e4;
  undefined1 local_21e0 [16];
  undefined1 auStack_21d0 [16];
  undefined4 local_21c0;
  undefined4 local_21bc;
  undefined4 local_21b8;
  undefined4 local_21b4;
  undefined4 local_21b0;
  undefined4 local_21ac;
  undefined4 local_21a8;
  undefined4 local_21a4;
  undefined1 local_21a0 [16];
  undefined1 auStack_2190 [16];
  undefined4 local_2180;
  undefined4 local_217c;
  undefined4 local_2178;
  undefined4 local_2174;
  undefined4 local_2170;
  undefined4 local_216c;
  undefined4 local_2168;
  undefined4 local_2164;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined1 local_20a0 [32];
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined1 local_2060 [32];
  undefined1 local_2040 [32];
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined1 local_2000 [32];
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined1 local_1f20 [32];
  undefined1 local_1f00 [32];
  undefined1 local_1ee0 [32];
  undefined1 local_1ec0 [32];
  undefined1 local_1ea0 [32];
  undefined1 local_1e80 [32];
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined1 local_1dc0 [32];
  float local_1da0;
  float fStack_1d9c;
  float fStack_1d98;
  float fStack_1d94;
  float fStack_1d90;
  float fStack_1d8c;
  float fStack_1d88;
  float fStack_1d84;
  float local_1d80;
  float fStack_1d7c;
  float fStack_1d78;
  float fStack_1d74;
  float fStack_1d70;
  float fStack_1d6c;
  float fStack_1d68;
  float fStack_1d64;
  float local_1d60;
  float fStack_1d5c;
  float fStack_1d58;
  float fStack_1d54;
  float fStack_1d50;
  float fStack_1d4c;
  float fStack_1d48;
  float fStack_1d44;
  float local_1d40;
  float fStack_1d3c;
  float fStack_1d38;
  float fStack_1d34;
  float fStack_1d30;
  float fStack_1d2c;
  float fStack_1d28;
  float fStack_1d24;
  float local_1d20;
  float fStack_1d1c;
  float fStack_1d18;
  float fStack_1d14;
  float fStack_1d10;
  float fStack_1d0c;
  float fStack_1d08;
  float fStack_1d04;
  float local_1d00;
  float fStack_1cfc;
  float fStack_1cf8;
  float fStack_1cf4;
  float fStack_1cf0;
  float fStack_1cec;
  float fStack_1ce8;
  float fStack_1ce4;
  float local_1ce0;
  float fStack_1cdc;
  float fStack_1cd8;
  float fStack_1cd4;
  float fStack_1cd0;
  float fStack_1ccc;
  float fStack_1cc8;
  float fStack_1cc4;
  float local_1cc0;
  float fStack_1cbc;
  float fStack_1cb8;
  float fStack_1cb4;
  float fStack_1cb0;
  float fStack_1cac;
  float fStack_1ca8;
  float fStack_1ca4;
  float local_1ca0;
  float fStack_1c9c;
  float fStack_1c98;
  float fStack_1c94;
  float fStack_1c90;
  float fStack_1c8c;
  float fStack_1c88;
  float fStack_1c84;
  float local_1c80;
  float fStack_1c7c;
  float fStack_1c78;
  float fStack_1c74;
  float fStack_1c70;
  float fStack_1c6c;
  float fStack_1c68;
  float fStack_1c64;
  undefined1 local_1c60 [32];
  undefined1 local_1c40 [32];
  undefined1 local_1c20 [32];
  undefined1 local_1c00 [32];
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined1 local_1a40 [32];
  undefined1 local_1a20 [8];
  float fStack_1a18;
  float fStack_1a14;
  float fStack_1a10;
  float fStack_1a0c;
  float fStack_1a08;
  float fStack_1a04;
  float local_1a00;
  float fStack_19fc;
  float fStack_19f8;
  float fStack_19f4;
  float fStack_19f0;
  float fStack_19ec;
  float fStack_19e8;
  float fStack_19e4;
  undefined4 local_19d4;
  undefined4 local_19d0;
  undefined4 local_19cc;
  undefined4 local_19c8;
  undefined4 local_19c4;
  undefined4 local_19c0;
  undefined4 local_19bc;
  undefined4 local_19b8;
  undefined4 local_19b4;
  undefined4 local_19b0;
  undefined4 local_19ac;
  undefined4 local_19a8;
  undefined4 local_19a4;
  undefined1 local_19a0 [16];
  undefined1 auStack_1990 [16];
  undefined4 local_1980;
  undefined4 local_197c;
  undefined4 local_1978;
  undefined4 local_1974;
  undefined4 local_1970;
  undefined4 local_196c;
  undefined4 local_1968;
  undefined4 local_1964;
  undefined1 local_1960 [16];
  undefined1 auStack_1950 [16];
  undefined4 local_1940;
  undefined4 local_193c;
  undefined4 local_1938;
  undefined4 local_1934;
  undefined4 local_1930;
  undefined4 local_192c;
  undefined4 local_1928;
  undefined4 local_1924;
  undefined1 local_1920 [16];
  undefined1 auStack_1910 [16];
  undefined4 local_1900;
  undefined4 local_18fc;
  undefined4 local_18f8;
  undefined4 local_18f4;
  undefined4 local_18f0;
  undefined4 local_18ec;
  undefined4 local_18e8;
  undefined4 local_18e4;
  undefined1 local_18e0 [16];
  undefined1 auStack_18d0 [16];
  undefined4 local_18c0;
  undefined4 local_18bc;
  undefined4 local_18b8;
  undefined4 local_18b4;
  undefined4 local_18b0;
  undefined4 local_18ac;
  undefined4 local_18a8;
  undefined4 local_18a4;
  undefined1 local_18a0 [16];
  undefined1 auStack_1890 [16];
  undefined4 local_1880;
  undefined4 local_187c;
  undefined4 local_1878;
  undefined4 local_1874;
  undefined4 local_1870;
  undefined4 local_186c;
  undefined4 local_1868;
  undefined4 local_1864;
  undefined1 local_1860 [16];
  undefined1 auStack_1850 [16];
  undefined4 local_1840;
  undefined4 local_183c;
  undefined4 local_1838;
  undefined4 local_1834;
  undefined4 local_1830;
  undefined4 local_182c;
  undefined4 local_1828;
  undefined4 local_1824;
  undefined1 local_1820 [16];
  undefined1 auStack_1810 [16];
  undefined4 local_1800;
  undefined4 local_17fc;
  undefined4 local_17f8;
  undefined4 local_17f4;
  undefined4 local_17f0;
  undefined4 local_17ec;
  undefined4 local_17e8;
  undefined4 local_17e4;
  undefined1 local_17e0 [16];
  undefined1 auStack_17d0 [16];
  undefined4 local_17c0;
  undefined4 local_17bc;
  undefined4 local_17b8;
  undefined4 local_17b4;
  undefined4 local_17b0;
  undefined4 local_17ac;
  undefined4 local_17a8;
  undefined4 local_17a4;
  undefined1 local_17a0 [16];
  undefined1 auStack_1790 [16];
  undefined4 local_1780;
  undefined4 local_177c;
  undefined4 local_1778;
  undefined4 local_1774;
  undefined4 local_1770;
  undefined4 local_176c;
  undefined4 local_1768;
  undefined4 local_1764;
  undefined1 local_1760 [16];
  undefined1 auStack_1750 [16];
  undefined4 local_1740;
  undefined4 local_173c;
  undefined4 local_1738;
  undefined4 local_1734;
  undefined4 local_1730;
  undefined4 local_172c;
  undefined4 local_1728;
  undefined4 local_1724;
  undefined1 local_1720 [16];
  undefined1 auStack_1710 [16];
  undefined4 local_1700;
  undefined4 local_16fc;
  undefined4 local_16f8;
  undefined4 local_16f4;
  undefined4 local_16f0;
  undefined4 local_16ec;
  undefined4 local_16e8;
  undefined4 local_16e4;
  undefined1 local_16e0 [16];
  undefined1 auStack_16d0 [16];
  undefined4 local_16c0;
  undefined4 local_16bc;
  undefined4 local_16b8;
  undefined4 local_16b4;
  undefined4 local_16b0;
  undefined4 local_16ac;
  undefined4 local_16a8;
  undefined4 local_16a4;
  undefined1 local_16a0 [16];
  undefined1 auStack_1690 [16];
  undefined4 local_1680;
  undefined4 local_167c;
  undefined4 local_1678;
  undefined4 local_1674;
  undefined4 local_1670;
  undefined4 local_166c;
  undefined4 local_1668;
  undefined4 local_1664;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  float *local_1558;
  float *local_1550;
  float *local_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  float local_1520;
  float fStack_151c;
  float fStack_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  float fStack_1508;
  float fStack_1504;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 *local_14b8;
  float *local_14b0;
  float *local_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  float local_1480;
  float fStack_147c;
  float fStack_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1468;
  float fStack_1464;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 *local_1418;
  float *local_1410;
  float *local_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 *local_1378;
  float *local_1370;
  float *local_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  float local_1340;
  float fStack_133c;
  float fStack_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float fStack_1328;
  float fStack_1324;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 *local_12d8;
  undefined8 *local_12d0;
  float *local_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 *local_1238;
  float *local_1230;
  float *local_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  float local_1200;
  float fStack_11fc;
  float fStack_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 *local_1198;
  float *local_1190;
  float *local_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 *local_10f8;
  undefined8 *local_10f0;
  float *local_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  float fStack_10a4;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  float local_f40;
  float fStack_f3c;
  float fStack_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  float fStack_f28;
  float fStack_f24;
  undefined1 local_f20 [32];
  undefined1 local_f00 [32];
  undefined1 local_ee0 [32];
  undefined1 local_ec0 [32];
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined1 local_da0 [32];
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined1 local_d20 [16];
  undefined1 local_d10 [16];
  float local_d00;
  float fStack_cfc;
  float fStack_cf8;
  float fStack_cf4;
  undefined1 local_cf0 [16];
  undefined1 local_ce0 [16];
  undefined1 local_cd0 [16];
  undefined1 local_cc0 [16];
  undefined1 local_cb0 [16];
  undefined1 local_ca0 [16];
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 local_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 local_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 local_c30;
  undefined8 uStack_c28;
  undefined1 local_c20 [8];
  float fStack_c18;
  float fStack_c14;
  undefined8 local_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined1 local_bb0 [16];
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined1 local_b90 [16];
  undefined1 local_b80 [16];
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined1 local_b60 [16];
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined1 local_a40 [16];
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined1 local_a20 [16];
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined4 local_9c4;
  undefined4 local_9c0;
  undefined4 uStack_9bc;
  undefined4 uStack_9b8;
  undefined4 uStack_9b4;
  undefined4 local_9a8;
  undefined4 local_9a4;
  undefined4 local_9a0;
  undefined4 uStack_99c;
  undefined4 uStack_998;
  undefined4 uStack_994;
  undefined4 local_988;
  undefined4 local_984;
  undefined4 local_980;
  undefined4 uStack_97c;
  undefined4 uStack_978;
  undefined4 uStack_974;
  undefined4 local_968;
  undefined4 local_964;
  undefined4 local_960;
  undefined4 uStack_95c;
  undefined4 uStack_958;
  undefined4 uStack_954;
  undefined4 local_944;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 local_910;
  undefined8 uStack_908;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float local_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float local_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float local_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float local_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float local_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  undefined1 local_840 [16];
  undefined1 local_830 [16];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined1 local_750 [16];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float local_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  float *local_618;
  float *local_610;
  float *local_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 *local_5b8;
  float *local_5b0;
  float *local_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  float local_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 *local_558;
  float *local_550;
  float *local_548;
  undefined8 local_540;
  undefined8 uStack_538;
  float local_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 *local_4f8;
  float *local_4f0;
  float *local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  float local_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 *local_498;
  undefined8 *local_490;
  float *local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  float local_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 *local_438;
  float *local_430;
  float *local_428;
  undefined8 local_420;
  undefined8 uStack_418;
  float local_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 *local_3d8;
  float *local_3d0;
  float *local_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  float local_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 *local_378;
  undefined8 *local_370;
  float *local_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  float local_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 local_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 local_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_f4;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined1 local_70 [16];
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_25b8 = *in_RDI;
  local_25bc = 0;
  if (in_R8D == 4) {
    local_2670 = *(undefined8 *)in_RDI;
    uStack_2668 = *(undefined8 *)(in_RDI + 2);
  }
  else {
    local_2670 = CONCAT44(local_25b8,local_25b8);
    uStack_2668 = CONCAT44(local_25b8,local_25b8);
    local_2520 = local_25b8;
    fStack_251c = local_25b8;
    fStack_2518 = local_25b8;
    fStack_2514 = local_25b8;
    local_2504 = local_25b8;
  }
  local_25d0 = local_2670;
  uStack_25c8 = uStack_2668;
  if (in_R8D == 8) {
    local_26a0 = *(undefined8 *)in_RDI;
    uStack_2698 = *(undefined8 *)(in_RDI + 2);
    uStack_2690 = *(undefined8 *)(in_RDI + 4);
    uStack_2688 = *(undefined8 *)(in_RDI + 6);
  }
  else {
    local_2500 = local_2670;
    uStack_24f8 = uStack_2668;
    local_26a0 = local_2670;
    uStack_2698 = uStack_2668;
    uStack_2690 = local_2670;
    uStack_2688 = uStack_2668;
  }
  local_2600 = local_26a0;
  uStack_25f8 = uStack_2698;
  uStack_25f0 = uStack_2690;
  uStack_25e8 = uStack_2688;
  local_25a8 = in_RDX;
  local_25a0 = in_RSI;
  for (; local_25bc + 7 < in_ECX; local_25bc = local_25bc + 8) {
    local_2590 = local_25a0;
    local_2620 = *(undefined8 *)*local_25a0;
    uStack_2618 = *(undefined8 *)(*local_25a0 + 8);
    uStack_2610 = *(undefined8 *)(*local_25a0 + 0x10);
    uStack_2608 = *(undefined8 *)(*local_25a0 + 0x18);
    local_24d8 = local_25b1;
    local_24e0 = &local_2600;
    local_24e8 = &local_2620;
    local_22e0 = local_26a0;
    uStack_22d8 = uStack_2698;
    uStack_22d0 = uStack_2690;
    uStack_22c8 = uStack_2688;
    auVar39._8_8_ = uStack_2698;
    auVar39._0_8_ = local_26a0;
    auVar39._16_8_ = uStack_2690;
    auVar39._24_8_ = uStack_2688;
    auVar38._8_8_ = uStack_2698;
    auVar38._0_8_ = local_26a0;
    auVar38._16_8_ = uStack_2690;
    auVar38._24_8_ = uStack_2688;
    auVar37._8_8_ = uStack_2698;
    auVar37._0_8_ = local_26a0;
    auVar37._16_8_ = uStack_2690;
    auVar37._24_8_ = uStack_2688;
    auVar36._8_8_ = uStack_2698;
    auVar36._0_8_ = local_26a0;
    auVar36._16_8_ = uStack_2690;
    auVar36._24_8_ = uStack_2688;
    local_2264 = 0;
    local_2240 = 0;
    auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
    local_2260 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
    auStack_2250 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
    local_2320 = local_2260._0_8_;
    uStack_2318 = local_2260._8_8_;
    uStack_2310 = auStack_2250._0_8_;
    uStack_2308 = auStack_2250._8_8_;
    local_2268 = 0x80000000;
    local_2200 = 0x80000000;
    auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
    local_2220 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
    auStack_2210 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
    local_2340 = local_2220._0_8_;
    uStack_2338 = local_2220._8_8_;
    uStack_2330 = auStack_2210._0_8_;
    uStack_2328 = auStack_2210._8_8_;
    local_226c = 0x40490fdb;
    local_21c0 = 0x40490fdb;
    auVar2 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x20);
    local_21e0 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x20);
    auStack_21d0 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x30);
    local_2360 = local_21e0._0_8_;
    uStack_2358 = local_21e0._8_8_;
    uStack_2350 = auStack_21d0._0_8_;
    uStack_2348 = auStack_21d0._8_8_;
    local_2270 = 0x3fc90fdb;
    local_2180 = 0x3fc90fdb;
    auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
    local_21a0 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
    auStack_2190 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
    local_2380 = local_21a0._0_8_;
    uStack_2378 = local_21a0._8_8_;
    uStack_2370 = auStack_2190._0_8_;
    uStack_2368 = auStack_2190._8_8_;
    auVar1._16_8_ = auStack_2250._0_8_;
    auVar1._0_16_ = local_2260;
    auVar1._24_8_ = auStack_2250._8_8_;
    local_23a0 = vcmpps_avx(*local_25a0,auVar1,4);
    auVar3._16_8_ = auStack_2250._0_8_;
    auVar3._0_16_ = local_2260;
    auVar3._24_8_ = auStack_2250._8_8_;
    local_23c0 = vcmpps_avx(auVar36,auVar3,4);
    local_1f40 = local_23a0._0_8_;
    uStack_1f38 = local_23a0._8_8_;
    uStack_1f30 = local_23a0._16_8_;
    uStack_1f28 = local_23a0._24_8_;
    local_1f60 = local_23c0._0_8_;
    uStack_1f58 = local_23c0._8_8_;
    uStack_1f50 = local_23c0._16_8_;
    uStack_1f48 = local_23c0._24_8_;
    local_23e0 = vandps_avx(local_23a0,local_23c0);
    local_1f80 = local_2220._0_8_;
    uStack_1f78 = local_2220._8_8_;
    uStack_1f70 = auStack_2210._0_8_;
    uStack_1f68 = auStack_2210._8_8_;
    auVar10._16_8_ = auStack_2210._0_8_;
    auVar10._0_16_ = local_2220;
    auVar10._24_8_ = auStack_2210._8_8_;
    local_2400 = vandps_avx(auVar10,*local_25a0);
    local_1fc0 = local_2220._0_8_;
    uStack_1fb8 = local_2220._8_8_;
    uStack_1fb0 = auStack_2210._0_8_;
    uStack_1fa8 = auStack_2210._8_8_;
    auVar9._16_8_ = auStack_2210._0_8_;
    auVar9._0_16_ = local_2220;
    auVar9._24_8_ = auStack_2210._8_8_;
    local_2420 = vandps_avx(auVar9,auVar37);
    auVar4._16_8_ = auStack_2250._0_8_;
    auVar4._0_16_ = local_2260;
    auVar4._24_8_ = auStack_2250._8_8_;
    local_2040 = vcmpps_avx(*local_25a0,auVar4,1);
    local_2000 = vcmpps_avx(auVar38,auVar4,1);
    local_2020 = local_2220._0_8_;
    uStack_2018 = local_2220._8_8_;
    uStack_2010 = auStack_2210._0_8_;
    uStack_2008 = auStack_2210._8_8_;
    auVar8._16_8_ = auStack_2210._0_8_;
    auVar8._0_16_ = local_2220;
    auVar8._24_8_ = auStack_2210._8_8_;
    local_1dc0 = vandps_avx(local_2000,auVar8);
    local_1de0 = local_21e0._0_8_;
    uStack_1dd8 = local_21e0._8_8_;
    uStack_1dd0 = auStack_21d0._0_8_;
    uStack_1dc8 = auStack_21d0._8_8_;
    auVar13._16_8_ = auStack_21d0._0_8_;
    auVar13._0_16_ = local_21e0;
    auVar13._24_8_ = auStack_21d0._8_8_;
    local_2060 = vorps_avx(local_1dc0,auVar13);
    local_2440 = vandps_avx(local_2040,local_2060);
    local_1a40 = vdivps_avx(auVar39,*local_25a0);
    local_19a4 = 0x80000000;
    local_1980 = 0x80000000;
    auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
    local_19a0 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
    auStack_1990 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
    local_1a60 = local_19a0._0_8_;
    uStack_1a58 = local_19a0._8_8_;
    uStack_1a50 = auStack_1990._0_8_;
    uStack_1a48 = auStack_1990._8_8_;
    local_19a8 = 0x3f800000;
    local_1940 = 0x3f800000;
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    local_1960 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    auStack_1950 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    local_1a80 = local_1960._0_8_;
    uStack_1a78 = local_1960._8_8_;
    uStack_1a70 = auStack_1950._0_8_;
    uStack_1a68 = auStack_1950._8_8_;
    local_19ac = 0xbf800000;
    local_1900 = 0xbf800000;
    auVar2 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x20);
    local_1920 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x20);
    auStack_1910 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x30);
    local_1aa0 = local_1920._0_8_;
    uStack_1a98 = local_1920._8_8_;
    uStack_1a90 = auStack_1910._0_8_;
    uStack_1a88 = auStack_1910._8_8_;
    local_19b0 = 0x3fc90fdb;
    local_18c0 = 0x3fc90fdb;
    auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
    local_18e0 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
    auStack_18d0 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
    local_1ac0 = local_18e0._0_8_;
    uStack_1ab8 = local_18e0._8_8_;
    uStack_1ab0 = auStack_18d0._0_8_;
    uStack_1aa8 = auStack_18d0._8_8_;
    local_19b4 = 0x3f800000;
    local_1880 = 0x3f800000;
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    local_18a0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    auStack_1890 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    local_1ae0 = local_18a0._0_8_;
    uStack_1ad8 = local_18a0._8_8_;
    uStack_1ad0 = auStack_1890._0_8_;
    uStack_1ac8 = auStack_1890._8_8_;
    local_19b8 = 0xbeaaaa53;
    local_1840 = 0xbeaaaa53;
    auVar2 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x20);
    local_1860 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x20);
    auStack_1850 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x30);
    local_1b00 = local_1860._0_8_;
    uStack_1af8 = local_1860._8_8_;
    uStack_1af0 = auStack_1850._0_8_;
    uStack_1ae8 = auStack_1850._8_8_;
    local_19bc = 0x3e4cb974;
    local_1800 = 0x3e4cb974;
    auVar2 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x20);
    local_1820 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x20);
    auStack_1810 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x30);
    local_1b20 = local_1820._0_8_;
    uStack_1b18 = local_1820._8_8_;
    uStack_1b10 = auStack_1810._0_8_;
    uStack_1b08 = auStack_1810._8_8_;
    local_19c0 = 0xbe117200;
    local_17c0 = 0xbe117200;
    auVar2 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x20);
    local_17e0 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x20);
    auStack_17d0 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x30);
    local_1b40 = local_17e0._0_8_;
    uStack_1b38 = local_17e0._8_8_;
    uStack_1b30 = auStack_17d0._0_8_;
    uStack_1b28 = auStack_17d0._8_8_;
    local_19c4 = 0x3dd9ed24;
    local_1780 = 0x3dd9ed24;
    auVar2 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x20);
    local_17a0 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x20);
    auStack_1790 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x30);
    local_1b60 = local_17a0._0_8_;
    uStack_1b58 = local_17a0._8_8_;
    uStack_1b50 = auStack_1790._0_8_;
    uStack_1b48 = auStack_1790._8_8_;
    local_19c8 = 0xbd99b01e;
    local_1740 = 0xbd99b01e;
    auVar2 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x20);
    local_1760 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x20);
    auStack_1750 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x30);
    local_1b80 = local_1760._0_8_;
    uStack_1b78 = local_1760._8_8_;
    uStack_1b70 = auStack_1750._0_8_;
    uStack_1b68 = auStack_1750._8_8_;
    local_19cc = 0x3d2edd4e;
    local_1700 = 0x3d2edd4e;
    auVar2 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x20);
    local_1720 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x20);
    auStack_1710 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x30);
    local_1ba0 = local_1720._0_8_;
    uStack_1b98 = local_1720._8_8_;
    uStack_1b90 = auStack_1710._0_8_;
    uStack_1b88 = auStack_1710._8_8_;
    local_19d0 = 0xbc83a25c;
    local_16c0 = 0xbc83a25c;
    auVar2 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x20);
    local_16e0 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x20);
    auStack_16d0 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x30);
    local_1bc0 = local_16e0._0_8_;
    uStack_1bb8 = local_16e0._8_8_;
    uStack_1bb0 = auStack_16d0._0_8_;
    uStack_1ba8 = auStack_16d0._8_8_;
    local_19d4 = 0x3b3ac537;
    local_1680 = 0x3b3ac537;
    auVar2 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x20);
    local_16a0 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x20);
    auStack_1690 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x30);
    local_1be0 = local_16a0._0_8_;
    uStack_1bd8 = local_16a0._8_8_;
    uStack_1bd0 = auStack_1690._0_8_;
    uStack_1bc8 = auStack_1690._8_8_;
    local_f80 = local_19a0._0_8_;
    uStack_f78 = local_19a0._8_8_;
    uStack_f70 = auStack_1990._0_8_;
    uStack_f68 = auStack_1990._8_8_;
    local_fa0 = local_1a40._0_8_;
    uStack_f98 = local_1a40._8_8_;
    uStack_f90 = local_1a40._16_8_;
    uStack_f88 = local_1a40._24_8_;
    auVar17._16_8_ = auStack_1990._0_8_;
    auVar17._0_16_ = local_19a0;
    auVar17._24_8_ = auStack_1990._8_8_;
    local_1c00 = vandps_avx(auVar17,local_1a40);
    local_e00 = local_19a0._0_8_;
    uStack_df8 = local_19a0._8_8_;
    uStack_df0 = auStack_1990._0_8_;
    uStack_de8 = auStack_1990._8_8_;
    local_e20 = local_1a40._0_8_;
    uStack_e18 = local_1a40._8_8_;
    uStack_e10 = local_1a40._16_8_;
    uStack_e08 = local_1a40._24_8_;
    auVar20._16_8_ = auStack_1990._0_8_;
    auVar20._0_16_ = local_19a0;
    auVar20._24_8_ = auStack_1990._8_8_;
    auVar1 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
    local_1c20 = vandnps_avx(auVar20,local_1a40);
    auVar14._16_8_ = auStack_1950._0_8_;
    auVar14._0_16_ = local_1960;
    auVar14._24_8_ = auStack_1950._8_8_;
    local_1c40 = vcmpps_avx(auVar14,local_1c20,1);
    local_fc0 = local_1c40._0_8_;
    uStack_fb8 = local_1c40._8_8_;
    uStack_fb0 = local_1c40._16_8_;
    uStack_fa8 = local_1c40._24_8_;
    local_fe0 = local_1920._0_8_;
    uStack_fd8 = local_1920._8_8_;
    uStack_fd0 = auStack_1910._0_8_;
    uStack_fc8 = auStack_1910._8_8_;
    auVar16._16_8_ = auStack_1910._0_8_;
    auVar16._0_16_ = local_1920;
    auVar16._24_8_ = auStack_1910._8_8_;
    local_ec0 = vandps_avx(local_1c40,auVar16);
    local_e40 = local_1c40._0_8_;
    uStack_e38 = local_1c40._8_8_;
    uStack_e30 = local_1c40._16_8_;
    uStack_e28 = local_1c40._24_8_;
    local_e60 = local_1c20._0_8_;
    uStack_e58 = local_1c20._8_8_;
    uStack_e50 = local_1c20._16_8_;
    uStack_e48 = local_1c20._24_8_;
    local_ee0 = vandnps_avx(local_1c40,local_1c20);
    local_1580 = vorps_avx(local_ec0,local_ee0);
    local_1000 = local_1c40._0_8_;
    uStack_ff8 = local_1c40._8_8_;
    uStack_ff0 = local_1c40._16_8_;
    uStack_fe8 = local_1c40._24_8_;
    local_1020 = local_1c20._0_8_;
    uStack_1018 = local_1c20._8_8_;
    uStack_1010 = local_1c20._16_8_;
    uStack_1008 = local_1c20._24_8_;
    local_f00 = vandps_avx(local_1c40,local_1c20);
    local_e80 = local_1c40._0_8_;
    uStack_e78 = local_1c40._8_8_;
    uStack_e70 = local_1c40._16_8_;
    uStack_e68 = local_1c40._24_8_;
    local_ea0 = local_1960._0_8_;
    uStack_e98 = local_1960._8_8_;
    uStack_e90 = auStack_1950._0_8_;
    uStack_e88 = auStack_1950._8_8_;
    auVar19._16_8_ = auStack_1950._0_8_;
    auVar19._0_16_ = local_1960;
    auVar19._24_8_ = auStack_1950._8_8_;
    local_f20 = vandnps_avx(local_1c40,auVar19);
    local_15a0 = vorps_avx(local_f00,local_f20);
    local_1c60 = vdivps_avx(local_1580,local_15a0);
    local_15e0 = local_1c60._0_8_;
    uStack_15d8 = local_1c60._8_8_;
    uStack_15d0 = local_1c60._16_8_;
    uStack_15c8 = local_1c60._24_8_;
    local_15c0._0_4_ = local_1c60._0_4_;
    local_15c0._4_4_ = local_1c60._4_4_;
    uStack_15b8._0_4_ = local_1c60._8_4_;
    uStack_15b8._4_4_ = local_1c60._12_4_;
    uStack_15b0._0_4_ = local_1c60._16_4_;
    uStack_15b0._4_4_ = local_1c60._20_4_;
    uStack_15a8._0_4_ = local_1c60._24_4_;
    uStack_15a8._4_4_ = local_1c60._28_4_;
    fStack_1c64 = uStack_15a8._4_4_;
    local_1c80 = (float)local_15c0 * (float)local_15c0;
    fStack_1c7c = local_15c0._4_4_ * local_15c0._4_4_;
    fStack_1c78 = (float)uStack_15b8 * (float)uStack_15b8;
    fStack_1c74 = uStack_15b8._4_4_ * uStack_15b8._4_4_;
    fStack_1c70 = (float)uStack_15b0 * (float)uStack_15b0;
    fStack_1c6c = uStack_15b0._4_4_ * uStack_15b0._4_4_;
    fStack_1c68 = (float)uStack_15a8 * (float)uStack_15a8;
    local_1620 = CONCAT44(fStack_1c7c,local_1c80);
    uStack_1618 = CONCAT44(fStack_1c74,fStack_1c78);
    uStack_1610 = CONCAT44(fStack_1c6c,fStack_1c70);
    uStack_1608 = CONCAT44(uStack_15a8._4_4_,fStack_1c68);
    fStack_1c84 = uStack_15a8._4_4_;
    local_1ca0 = local_1c80 * local_1c80;
    fStack_1c9c = fStack_1c7c * fStack_1c7c;
    fStack_1c98 = fStack_1c78 * fStack_1c78;
    fStack_1c94 = fStack_1c74 * fStack_1c74;
    fStack_1c90 = fStack_1c70 * fStack_1c70;
    fStack_1c8c = fStack_1c6c * fStack_1c6c;
    fStack_1c88 = fStack_1c68 * fStack_1c68;
    local_14a8 = &local_1ca0;
    local_10f0 = &local_1bc0;
    local_10f8 = &local_1b80;
    local_1080 = CONCAT44(fStack_1c9c,local_1ca0);
    uStack_1078 = CONCAT44(fStack_1c94,fStack_1c98);
    uStack_1070 = CONCAT44(fStack_1c8c,fStack_1c90);
    uStack_1068 = CONCAT44(uStack_15a8._4_4_,fStack_1c88);
    local_10a0._0_4_ = local_16e0._0_4_;
    local_10a0._4_4_ = local_16e0._4_4_;
    uStack_1098._0_4_ = local_16e0._8_4_;
    uStack_1098._4_4_ = local_16e0._12_4_;
    uStack_1090._0_4_ = auStack_16d0._0_4_;
    uStack_1090._4_4_ = auStack_16d0._4_4_;
    uStack_1088._0_4_ = auStack_16d0._8_4_;
    uStack_1088._4_4_ = auStack_16d0._12_4_;
    fStack_10a4 = uStack_1088._4_4_;
    local_10c0 = local_1ca0 * (float)local_10a0;
    fStack_10bc = fStack_1c9c * local_10a0._4_4_;
    fStack_10b8 = fStack_1c98 * (float)uStack_1098;
    fStack_10b4 = fStack_1c94 * uStack_1098._4_4_;
    fStack_10b0 = fStack_1c90 * (float)uStack_1090;
    fStack_10ac = fStack_1c8c * uStack_1090._4_4_;
    fStack_10a8 = fStack_1c88 * (float)uStack_1088;
    local_10e0._0_4_ = local_1760._0_4_;
    local_10e0._4_4_ = local_1760._4_4_;
    uStack_10d8._0_4_ = local_1760._8_4_;
    uStack_10d8._4_4_ = local_1760._12_4_;
    uStack_10d0._0_4_ = auStack_1750._0_4_;
    uStack_10d0._4_4_ = auStack_1750._4_4_;
    uStack_10c8._0_4_ = auStack_1750._8_4_;
    uStack_10c8._4_4_ = auStack_1750._12_4_;
    local_1d20 = local_10c0 + (float)local_10e0;
    fStack_1d1c = fStack_10bc + local_10e0._4_4_;
    fStack_1d18 = fStack_10b8 + (float)uStack_10d8;
    fStack_1d14 = fStack_10b4 + uStack_10d8._4_4_;
    fStack_1d10 = fStack_10b0 + (float)uStack_10d0;
    fStack_1d0c = fStack_10ac + uStack_10d0._4_4_;
    fStack_1d08 = fStack_10a8 + (float)uStack_10c8;
    fStack_1d04 = uStack_1088._4_4_ + uStack_10c8._4_4_;
    local_1190 = &local_1d20;
    local_1198 = &local_1b40;
    local_1120 = CONCAT44(fStack_1c9c,local_1ca0);
    uStack_1118 = CONCAT44(fStack_1c94,fStack_1c98);
    uStack_1110 = CONCAT44(fStack_1c8c,fStack_1c90);
    uStack_1108 = CONCAT44(uStack_15a8._4_4_,fStack_1c88);
    local_1140 = CONCAT44(fStack_1d1c,local_1d20);
    uStack_1138 = CONCAT44(fStack_1d14,fStack_1d18);
    uStack_1130 = CONCAT44(fStack_1d0c,fStack_1d10);
    uStack_1128 = CONCAT44(fStack_1d04,fStack_1d08);
    local_1160 = local_1ca0 * local_1d20;
    fStack_115c = fStack_1c9c * fStack_1d1c;
    fStack_1158 = fStack_1c98 * fStack_1d18;
    fStack_1154 = fStack_1c94 * fStack_1d14;
    fStack_1150 = fStack_1c90 * fStack_1d10;
    fStack_114c = fStack_1c8c * fStack_1d0c;
    fStack_1148 = fStack_1c88 * fStack_1d08;
    local_1180._0_4_ = local_17e0._0_4_;
    local_1180._4_4_ = local_17e0._4_4_;
    uStack_1178._0_4_ = local_17e0._8_4_;
    uStack_1178._4_4_ = local_17e0._12_4_;
    uStack_1170._0_4_ = auStack_17d0._0_4_;
    uStack_1170._4_4_ = auStack_17d0._4_4_;
    uStack_1168._0_4_ = auStack_17d0._8_4_;
    uStack_1168._4_4_ = auStack_17d0._12_4_;
    local_1d00 = local_1160 + (float)local_1180;
    fStack_1cfc = fStack_115c + local_1180._4_4_;
    fStack_1cf8 = fStack_1158 + (float)uStack_1178;
    fStack_1cf4 = fStack_1154 + uStack_1178._4_4_;
    fStack_1cf0 = fStack_1150 + (float)uStack_1170;
    fStack_1cec = fStack_114c + uStack_1170._4_4_;
    fStack_1ce8 = fStack_1148 + (float)uStack_1168;
    fStack_1ce4 = fStack_1d04 + uStack_1168._4_4_;
    local_1230 = &local_1d00;
    local_1238 = &local_1b00;
    local_11c0 = CONCAT44(fStack_1c9c,local_1ca0);
    uStack_11b8 = CONCAT44(fStack_1c94,fStack_1c98);
    uStack_11b0 = CONCAT44(fStack_1c8c,fStack_1c90);
    uStack_11a8 = CONCAT44(uStack_15a8._4_4_,fStack_1c88);
    local_11e0 = CONCAT44(fStack_1cfc,local_1d00);
    uStack_11d8 = CONCAT44(fStack_1cf4,fStack_1cf8);
    uStack_11d0 = CONCAT44(fStack_1cec,fStack_1cf0);
    uStack_11c8 = CONCAT44(fStack_1ce4,fStack_1ce8);
    local_1200 = local_1ca0 * local_1d00;
    fStack_11fc = fStack_1c9c * fStack_1cfc;
    fStack_11f8 = fStack_1c98 * fStack_1cf8;
    fStack_11f4 = fStack_1c94 * fStack_1cf4;
    fStack_11f0 = fStack_1c90 * fStack_1cf0;
    fStack_11ec = fStack_1c8c * fStack_1cec;
    fStack_11e8 = fStack_1c88 * fStack_1ce8;
    local_1220._0_4_ = local_1860._0_4_;
    local_1220._4_4_ = local_1860._4_4_;
    uStack_1218._0_4_ = local_1860._8_4_;
    uStack_1218._4_4_ = local_1860._12_4_;
    uStack_1210._0_4_ = auStack_1850._0_4_;
    uStack_1210._4_4_ = auStack_1850._4_4_;
    uStack_1208._0_4_ = auStack_1850._8_4_;
    uStack_1208._4_4_ = auStack_1850._12_4_;
    local_1ce0 = local_1200 + (float)local_1220;
    fStack_1cdc = fStack_11fc + local_1220._4_4_;
    fStack_1cd8 = fStack_11f8 + (float)uStack_1218;
    fStack_1cd4 = fStack_11f4 + uStack_1218._4_4_;
    fStack_1cd0 = fStack_11f0 + (float)uStack_1210;
    fStack_1ccc = fStack_11ec + uStack_1210._4_4_;
    fStack_1cc8 = fStack_11e8 + (float)uStack_1208;
    fStack_1cc4 = fStack_1ce4 + uStack_1208._4_4_;
    local_12d0 = &local_1be0;
    local_12d8 = &local_1ba0;
    local_1260 = CONCAT44(fStack_1c9c,local_1ca0);
    uStack_1258 = CONCAT44(fStack_1c94,fStack_1c98);
    uStack_1250 = CONCAT44(fStack_1c8c,fStack_1c90);
    uStack_1248 = CONCAT44(uStack_15a8._4_4_,fStack_1c88);
    local_1280._0_4_ = local_16a0._0_4_;
    local_1280._4_4_ = local_16a0._4_4_;
    uStack_1278._0_4_ = local_16a0._8_4_;
    uStack_1278._4_4_ = local_16a0._12_4_;
    uStack_1270._0_4_ = auStack_1690._0_4_;
    uStack_1270._4_4_ = auStack_1690._4_4_;
    uStack_1268._0_4_ = auStack_1690._8_4_;
    uStack_1268._4_4_ = auStack_1690._12_4_;
    fStack_1284 = uStack_1268._4_4_;
    local_12a0 = local_1ca0 * (float)local_1280;
    fStack_129c = fStack_1c9c * local_1280._4_4_;
    fStack_1298 = fStack_1c98 * (float)uStack_1278;
    fStack_1294 = fStack_1c94 * uStack_1278._4_4_;
    fStack_1290 = fStack_1c90 * (float)uStack_1270;
    fStack_128c = fStack_1c8c * uStack_1270._4_4_;
    fStack_1288 = fStack_1c88 * (float)uStack_1268;
    local_12c0._0_4_ = local_1720._0_4_;
    local_12c0._4_4_ = local_1720._4_4_;
    uStack_12b8._0_4_ = local_1720._8_4_;
    uStack_12b8._4_4_ = local_1720._12_4_;
    uStack_12b0._0_4_ = auStack_1710._0_4_;
    uStack_12b0._4_4_ = auStack_1710._4_4_;
    uStack_12a8._0_4_ = auStack_1710._8_4_;
    uStack_12a8._4_4_ = auStack_1710._12_4_;
    local_1da0 = local_12a0 + (float)local_12c0;
    fStack_1d9c = fStack_129c + local_12c0._4_4_;
    fStack_1d98 = fStack_1298 + (float)uStack_12b8;
    fStack_1d94 = fStack_1294 + uStack_12b8._4_4_;
    fStack_1d90 = fStack_1290 + (float)uStack_12b0;
    fStack_1d8c = fStack_128c + uStack_12b0._4_4_;
    fStack_1d88 = fStack_1288 + (float)uStack_12a8;
    fStack_1d84 = uStack_1268._4_4_ + uStack_12a8._4_4_;
    local_1370 = &local_1da0;
    local_1378 = &local_1b60;
    local_1300 = CONCAT44(fStack_1c9c,local_1ca0);
    uStack_12f8 = CONCAT44(fStack_1c94,fStack_1c98);
    uStack_12f0 = CONCAT44(fStack_1c8c,fStack_1c90);
    uStack_12e8 = CONCAT44(uStack_15a8._4_4_,fStack_1c88);
    local_1320 = CONCAT44(fStack_1d9c,local_1da0);
    uStack_1318 = CONCAT44(fStack_1d94,fStack_1d98);
    uStack_1310 = CONCAT44(fStack_1d8c,fStack_1d90);
    uStack_1308 = CONCAT44(fStack_1d84,fStack_1d88);
    local_1340 = local_1ca0 * local_1da0;
    fStack_133c = fStack_1c9c * fStack_1d9c;
    fStack_1338 = fStack_1c98 * fStack_1d98;
    fStack_1334 = fStack_1c94 * fStack_1d94;
    fStack_1330 = fStack_1c90 * fStack_1d90;
    fStack_132c = fStack_1c8c * fStack_1d8c;
    fStack_1328 = fStack_1c88 * fStack_1d88;
    local_1360._0_4_ = local_17a0._0_4_;
    local_1360._4_4_ = local_17a0._4_4_;
    uStack_1358._0_4_ = local_17a0._8_4_;
    uStack_1358._4_4_ = local_17a0._12_4_;
    uStack_1350._0_4_ = auStack_1790._0_4_;
    uStack_1350._4_4_ = auStack_1790._4_4_;
    uStack_1348._0_4_ = auStack_1790._8_4_;
    uStack_1348._4_4_ = auStack_1790._12_4_;
    local_1d80 = local_1340 + (float)local_1360;
    fStack_1d7c = fStack_133c + local_1360._4_4_;
    fStack_1d78 = fStack_1338 + (float)uStack_1358;
    fStack_1d74 = fStack_1334 + uStack_1358._4_4_;
    fStack_1d70 = fStack_1330 + (float)uStack_1350;
    fStack_1d6c = fStack_132c + uStack_1350._4_4_;
    fStack_1d68 = fStack_1328 + (float)uStack_1348;
    fStack_1d64 = fStack_1d84 + uStack_1348._4_4_;
    local_1410 = &local_1d80;
    local_1418 = &local_1b20;
    local_13a0 = CONCAT44(fStack_1c9c,local_1ca0);
    uStack_1398 = CONCAT44(fStack_1c94,fStack_1c98);
    uStack_1390 = CONCAT44(fStack_1c8c,fStack_1c90);
    uStack_1388 = CONCAT44(uStack_15a8._4_4_,fStack_1c88);
    local_13c0 = CONCAT44(fStack_1d7c,local_1d80);
    uStack_13b8 = CONCAT44(fStack_1d74,fStack_1d78);
    uStack_13b0 = CONCAT44(fStack_1d6c,fStack_1d70);
    uStack_13a8 = CONCAT44(fStack_1d64,fStack_1d68);
    local_13e0 = local_1ca0 * local_1d80;
    fStack_13dc = fStack_1c9c * fStack_1d7c;
    fStack_13d8 = fStack_1c98 * fStack_1d78;
    fStack_13d4 = fStack_1c94 * fStack_1d74;
    fStack_13d0 = fStack_1c90 * fStack_1d70;
    fStack_13cc = fStack_1c8c * fStack_1d6c;
    fStack_13c8 = fStack_1c88 * fStack_1d68;
    local_1400._0_4_ = local_1820._0_4_;
    local_1400._4_4_ = local_1820._4_4_;
    uStack_13f8._0_4_ = local_1820._8_4_;
    uStack_13f8._4_4_ = local_1820._12_4_;
    uStack_13f0._0_4_ = auStack_1810._0_4_;
    uStack_13f0._4_4_ = auStack_1810._4_4_;
    uStack_13e8._0_4_ = auStack_1810._8_4_;
    uStack_13e8._4_4_ = auStack_1810._12_4_;
    local_1d60 = local_13e0 + (float)local_1400;
    fStack_1d5c = fStack_13dc + local_1400._4_4_;
    fStack_1d58 = fStack_13d8 + (float)uStack_13f8;
    fStack_1d54 = fStack_13d4 + uStack_13f8._4_4_;
    fStack_1d50 = fStack_13d0 + (float)uStack_13f0;
    fStack_1d4c = fStack_13cc + uStack_13f0._4_4_;
    fStack_1d48 = fStack_13c8 + (float)uStack_13e8;
    fStack_1d44 = fStack_1d64 + uStack_13e8._4_4_;
    local_14b0 = &local_1d60;
    local_14b8 = &local_1ae0;
    local_1440 = CONCAT44(fStack_1c9c,local_1ca0);
    uStack_1438 = CONCAT44(fStack_1c94,fStack_1c98);
    uStack_1430 = CONCAT44(fStack_1c8c,fStack_1c90);
    uStack_1428 = CONCAT44(uStack_15a8._4_4_,fStack_1c88);
    local_1460 = CONCAT44(fStack_1d5c,local_1d60);
    uStack_1458 = CONCAT44(fStack_1d54,fStack_1d58);
    uStack_1450 = CONCAT44(fStack_1d4c,fStack_1d50);
    uStack_1448 = CONCAT44(fStack_1d44,fStack_1d48);
    local_1480 = local_1ca0 * local_1d60;
    fStack_147c = fStack_1c9c * fStack_1d5c;
    fStack_1478 = fStack_1c98 * fStack_1d58;
    fStack_1474 = fStack_1c94 * fStack_1d54;
    fStack_1470 = fStack_1c90 * fStack_1d50;
    fStack_146c = fStack_1c8c * fStack_1d4c;
    fStack_1468 = fStack_1c88 * fStack_1d48;
    local_14a0._0_4_ = local_18a0._0_4_;
    local_14a0._4_4_ = local_18a0._4_4_;
    uStack_1498._0_4_ = local_18a0._8_4_;
    uStack_1498._4_4_ = local_18a0._12_4_;
    uStack_1490._0_4_ = auStack_1890._0_4_;
    uStack_1490._4_4_ = auStack_1890._4_4_;
    uStack_1488._0_4_ = auStack_1890._8_4_;
    uStack_1488._4_4_ = auStack_1890._12_4_;
    local_1d40 = local_1480 + (float)local_14a0;
    fStack_1d3c = fStack_147c + local_14a0._4_4_;
    fStack_1d38 = fStack_1478 + (float)uStack_1498;
    fStack_1d34 = fStack_1474 + uStack_1498._4_4_;
    fStack_1d30 = fStack_1470 + (float)uStack_1490;
    fStack_1d2c = fStack_146c + uStack_1490._4_4_;
    fStack_1d28 = fStack_1468 + (float)uStack_1488;
    fStack_1d24 = fStack_1d44 + uStack_1488._4_4_;
    local_1548 = &local_1c80;
    local_1550 = &local_1ce0;
    local_1558 = &local_1d40;
    local_14e0 = CONCAT44(fStack_1c7c,local_1c80);
    uStack_14d8 = CONCAT44(fStack_1c74,fStack_1c78);
    uStack_14d0 = CONCAT44(fStack_1c6c,fStack_1c70);
    uStack_14c8 = CONCAT44(uStack_15a8._4_4_,fStack_1c68);
    local_1500 = CONCAT44(fStack_1cdc,local_1ce0);
    uStack_14f8 = CONCAT44(fStack_1cd4,fStack_1cd8);
    uStack_14f0 = CONCAT44(fStack_1ccc,fStack_1cd0);
    uStack_14e8 = CONCAT44(fStack_1cc4,fStack_1cc8);
    local_1520 = local_1c80 * local_1ce0;
    fStack_151c = fStack_1c7c * fStack_1cdc;
    fStack_1518 = fStack_1c78 * fStack_1cd8;
    fStack_1514 = fStack_1c74 * fStack_1cd4;
    fStack_1510 = fStack_1c70 * fStack_1cd0;
    fStack_150c = fStack_1c6c * fStack_1ccc;
    fStack_1508 = fStack_1c68 * fStack_1cc8;
    local_1540 = CONCAT44(fStack_1d3c,local_1d40);
    uStack_1538 = CONCAT44(fStack_1d34,fStack_1d38);
    uStack_1530 = CONCAT44(fStack_1d2c,fStack_1d30);
    uStack_1528 = CONCAT44(fStack_1d24,fStack_1d28);
    local_1cc0 = local_1520 + local_1d40;
    fStack_1cbc = fStack_151c + fStack_1d3c;
    fStack_1cb8 = fStack_1518 + fStack_1d38;
    fStack_1cb4 = fStack_1514 + fStack_1d34;
    fStack_1cb0 = fStack_1510 + fStack_1d30;
    fStack_1cac = fStack_150c + fStack_1d2c;
    fStack_1ca8 = fStack_1508 + fStack_1d28;
    fStack_1ca4 = fStack_1cc4 + fStack_1d24;
    local_1640 = CONCAT44(fStack_1cbc,local_1cc0);
    uStack_1638 = CONCAT44(fStack_1cb4,fStack_1cb8);
    uStack_1630 = CONCAT44(fStack_1cac,fStack_1cb0);
    uStack_1628 = CONCAT44(fStack_1ca4,fStack_1ca8);
    local_1660 = local_1c60._0_8_;
    uStack_1658 = local_1c60._8_8_;
    uStack_1650 = local_1c60._16_8_;
    uStack_1648 = local_1c60._24_8_;
    fStack_19e4 = uStack_15a8._4_4_;
    local_1a00 = local_1cc0 * (float)local_15c0;
    fStack_19fc = fStack_1cbc * local_15c0._4_4_;
    fStack_19f8 = fStack_1cb8 * (float)uStack_15b8;
    fStack_19f4 = fStack_1cb4 * uStack_15b8._4_4_;
    fStack_19f0 = fStack_1cb0 * (float)uStack_15b0;
    fStack_19ec = fStack_1cac * uStack_15b0._4_4_;
    fStack_19e8 = fStack_1ca8 * (float)uStack_15a8;
    local_1040 = local_1c40._0_8_;
    uStack_1038 = local_1c40._8_8_;
    uStack_1030 = local_1c40._16_8_;
    uStack_1028 = local_1c40._24_8_;
    local_1060 = local_18e0._0_8_;
    uStack_1058 = local_18e0._8_8_;
    uStack_1050 = auStack_18d0._0_8_;
    uStack_1048 = auStack_18d0._8_8_;
    auVar15._16_8_ = auStack_18d0._0_8_;
    auVar15._0_16_ = local_18e0;
    auVar15._24_8_ = auStack_18d0._8_8_;
    _local_1a20 = vandps_avx(local_1c40,auVar15);
    local_f40 = local_1a00 + (float)local_1a20._0_4_;
    fStack_f3c = fStack_19fc + (float)local_1a20._4_4_;
    fStack_f38 = fStack_19f8 + fStack_1a18;
    fStack_f34 = fStack_19f4 + fStack_1a14;
    fStack_f30 = fStack_19f0 + fStack_1a10;
    fStack_f2c = fStack_19ec + fStack_1a0c;
    fStack_f28 = fStack_19e8 + fStack_1a08;
    fStack_f24 = uStack_15a8._4_4_ + fStack_1a04;
    local_f60 = local_1c00._0_8_;
    uStack_f58 = local_1c00._8_8_;
    uStack_f50 = local_1c00._16_8_;
    uStack_f48 = local_1c00._24_8_;
    auVar18._4_4_ = fStack_f3c;
    auVar18._0_4_ = local_f40;
    auVar18._8_4_ = fStack_f38;
    auVar18._12_4_ = fStack_f34;
    auVar18._16_4_ = fStack_f30;
    auVar18._20_4_ = fStack_f2c;
    auVar18._24_4_ = fStack_f28;
    auVar18._28_4_ = fStack_f24;
    _local_22a0 = vorps_avx(auVar18,local_1c00);
    local_22c0._0_4_ = local_2440._0_4_;
    local_22c0._4_4_ = local_2440._4_4_;
    uStack_22b8._0_4_ = local_2440._8_4_;
    uStack_22b8._4_4_ = local_2440._12_4_;
    uStack_22b0._0_4_ = local_2440._16_4_;
    uStack_22b0._4_4_ = local_2440._20_4_;
    uStack_22a8._0_4_ = local_2440._24_4_;
    uStack_22a8._4_4_ = local_2440._28_4_;
    local_2460 = (float)local_22a0._0_4_ + (float)local_22c0;
    fStack_245c = (float)local_22a0._4_4_ + local_22c0._4_4_;
    fStack_2458 = fStack_2298 + (float)uStack_22b8;
    fStack_2454 = fStack_2294 + uStack_22b8._4_4_;
    fStack_2450 = fStack_2290 + (float)uStack_22b0;
    fStack_244c = fStack_228c + uStack_22b0._4_4_;
    fStack_2448 = fStack_2288 + (float)uStack_22a8;
    fStack_2444 = fStack_2284 + uStack_22a8._4_4_;
    local_1e00 = local_2400._0_8_;
    uStack_1df8 = local_2400._8_8_;
    uStack_1df0 = local_2400._16_8_;
    uStack_1de8 = local_2400._24_8_;
    local_1e20 = local_21e0._0_8_;
    uStack_1e18 = local_21e0._8_8_;
    uStack_1e10 = auStack_21d0._0_8_;
    uStack_1e08 = auStack_21d0._8_8_;
    auVar12._16_8_ = auStack_21d0._0_8_;
    auVar12._0_16_ = local_21e0;
    auVar12._24_8_ = auStack_21d0._8_8_;
    auVar3 = vorps_avx(local_2400,auVar12);
    auVar5._16_8_ = auStack_2250._0_8_;
    auVar5._0_16_ = local_2260;
    auVar5._24_8_ = auStack_2250._8_8_;
    local_2480 = vcmpps_avx(auVar3,auVar5,1);
    local_2080 = local_23c0._0_8_;
    uStack_2078 = local_23c0._8_8_;
    uStack_2070 = local_23c0._16_8_;
    uStack_2068 = local_23c0._24_8_;
    local_1e40 = local_2420._0_8_;
    uStack_1e38 = local_2420._8_8_;
    uStack_1e30 = local_2420._16_8_;
    uStack_1e28 = local_2420._24_8_;
    local_1e60 = local_21a0._0_8_;
    uStack_1e58 = local_21a0._8_8_;
    uStack_1e50 = auStack_2190._0_8_;
    uStack_1e48 = auStack_2190._8_8_;
    auVar11._16_8_ = auStack_2190._0_8_;
    auVar11._0_16_ = local_21a0;
    auVar11._24_8_ = auStack_2190._8_8_;
    local_20a0 = vorps_avx(local_2420,auVar11);
    local_1ec0 = vandps_avx(local_23c0,local_20a0);
    local_d80 = local_23c0._0_8_;
    uStack_d78 = local_23c0._8_8_;
    uStack_d70 = local_23c0._16_8_;
    uStack_d68 = local_23c0._24_8_;
    local_20c0 = local_2480._0_8_;
    uStack_20b8 = local_2480._8_8_;
    uStack_20b0 = local_2480._16_8_;
    uStack_20a8 = local_2480._24_8_;
    local_20e0 = local_21e0._0_8_;
    uStack_20d8 = local_21e0._8_8_;
    uStack_20d0 = auStack_21d0._0_8_;
    uStack_20c8 = auStack_21d0._8_8_;
    auVar7._16_8_ = auStack_21d0._0_8_;
    auVar7._0_16_ = local_21e0;
    auVar7._24_8_ = auStack_21d0._8_8_;
    local_1e80 = vandps_avx(local_2480,auVar7);
    local_d40 = local_2480._0_8_;
    uStack_d38 = local_2480._8_8_;
    uStack_d30 = local_2480._16_8_;
    uStack_d28 = local_2480._24_8_;
    local_d60 = local_2260._0_8_;
    uStack_d58 = local_2260._8_8_;
    uStack_d50 = auStack_2250._0_8_;
    uStack_d48 = auStack_2250._8_8_;
    auVar21._16_8_ = auStack_2250._0_8_;
    auVar21._0_16_ = local_2260;
    auVar21._24_8_ = auStack_2250._8_8_;
    local_1ea0 = vandnps_avx(local_2480,auVar21);
    local_da0 = vorps_avx(local_1e80,local_1ea0);
    local_1ee0 = vandnps_avx(local_23c0,local_da0);
    local_24a0 = vorps_avx(local_1ec0,local_1ee0);
    local_2100 = local_23e0._0_8_;
    uStack_20f8 = local_23e0._8_8_;
    uStack_20f0 = local_23e0._16_8_;
    uStack_20e8 = local_23e0._24_8_;
    local_2120 = CONCAT44(fStack_245c,local_2460);
    uStack_2118 = CONCAT44(fStack_2454,fStack_2458);
    uStack_2110 = CONCAT44(fStack_244c,fStack_2450);
    uStack_2108 = CONCAT44(fStack_2444,fStack_2448);
    auVar6._8_8_ = uStack_2118;
    auVar6._0_8_ = local_2120;
    auVar6._16_8_ = uStack_2110;
    auVar6._24_8_ = uStack_2108;
    local_1f00 = vandps_avx(local_23e0,auVar6);
    local_de0 = local_24a0._0_8_;
    uStack_dd8 = local_24a0._8_8_;
    uStack_dd0 = local_24a0._16_8_;
    uStack_dc8 = local_24a0._24_8_;
    local_dc0._0_4_ = local_23e0._0_4_;
    local_dc0._4_4_ = local_23e0._4_4_;
    uStack_db8._0_4_ = local_23e0._8_4_;
    uStack_db8._4_4_ = local_23e0._12_4_;
    uStack_db0._0_4_ = local_23e0._16_4_;
    uStack_db0._4_4_ = local_23e0._20_4_;
    uStack_da8._0_4_ = local_23e0._24_4_;
    uStack_da8._4_4_ = local_23e0._28_4_;
    auVar45._0_4_ = (uint)local_dc0 ^ auVar1._0_4_;
    auVar45._4_4_ = local_dc0._4_4_ ^ auVar1._4_4_;
    auVar45._8_4_ = (uint)uStack_db8 ^ auVar1._8_4_;
    auVar45._12_4_ = uStack_db8._4_4_ ^ auVar1._12_4_;
    auVar45._16_4_ = (uint)uStack_db0 ^ auVar1._16_4_;
    auVar45._20_4_ = uStack_db0._4_4_ ^ auVar1._20_4_;
    auVar45._24_4_ = (uint)uStack_da8 ^ auVar1._24_4_;
    auVar45._28_4_ = uStack_da8._4_4_ ^ auVar1._28_4_;
    local_1f20 = vandps_avx(auVar45,local_24a0);
    local_2640 = vorps_avx(local_1f00,local_1f20);
    local_2558 = local_25a8;
    local_2580 = local_2640._0_8_;
    uStack_2578 = local_2640._8_8_;
    uStack_2570 = local_2640._16_8_;
    uStack_2568 = local_2640._24_8_;
    *(undefined8 *)local_25a8 = local_2640._0_8_;
    *(undefined8 *)(local_25a8 + 2) = local_2640._8_8_;
    *(undefined8 *)(local_25a8 + 4) = local_2640._16_8_;
    *(undefined8 *)(local_25a8 + 6) = local_2640._24_8_;
    local_25a0 = local_25a0 + 1;
    local_25a8 = local_25a8 + 8;
    local_2300 = local_2620;
    uStack_22f8 = uStack_2618;
    uStack_22f0 = uStack_2610;
    uStack_22e8 = uStack_2608;
    local_22c0 = local_2440._0_8_;
    uStack_22b8 = local_2440._8_8_;
    uStack_22b0 = local_2440._16_8_;
    uStack_22a8 = local_2440._24_8_;
    local_223c = local_2240;
    local_2238 = local_2240;
    local_2234 = local_2240;
    local_2230 = local_2240;
    local_222c = local_2240;
    local_2228 = local_2240;
    local_2224 = local_2240;
    local_21fc = local_2200;
    local_21f8 = local_2200;
    local_21f4 = local_2200;
    local_21f0 = local_2200;
    local_21ec = local_2200;
    local_21e8 = local_2200;
    local_21e4 = local_2200;
    local_21bc = local_21c0;
    local_21b8 = local_21c0;
    local_21b4 = local_21c0;
    local_21b0 = local_21c0;
    local_21ac = local_21c0;
    local_21a8 = local_21c0;
    local_21a4 = local_21c0;
    local_217c = local_2180;
    local_2178 = local_2180;
    local_2174 = local_2180;
    local_2170 = local_2180;
    local_216c = local_2180;
    local_2168 = local_2180;
    local_2164 = local_2180;
    local_2160 = local_2620;
    uStack_2158 = uStack_2618;
    uStack_2150 = uStack_2610;
    uStack_2148 = uStack_2608;
    local_2140 = local_22e0;
    uStack_2138 = uStack_22d8;
    uStack_2130 = uStack_22d0;
    uStack_2128 = uStack_22c8;
    local_1fe0 = local_22e0;
    uStack_1fd8 = uStack_22d8;
    uStack_1fd0 = uStack_22d0;
    uStack_1fc8 = uStack_22c8;
    local_1fa0 = local_2620;
    uStack_1f98 = uStack_2618;
    uStack_1f90 = uStack_2610;
    uStack_1f88 = uStack_2608;
    local_197c = local_1980;
    local_1978 = local_1980;
    local_1974 = local_1980;
    local_1970 = local_1980;
    local_196c = local_1980;
    local_1968 = local_1980;
    local_1964 = local_1980;
    local_193c = local_1940;
    local_1938 = local_1940;
    local_1934 = local_1940;
    local_1930 = local_1940;
    local_192c = local_1940;
    local_1928 = local_1940;
    local_1924 = local_1940;
    local_18fc = local_1900;
    local_18f8 = local_1900;
    local_18f4 = local_1900;
    local_18f0 = local_1900;
    local_18ec = local_1900;
    local_18e8 = local_1900;
    local_18e4 = local_1900;
    local_18bc = local_18c0;
    local_18b8 = local_18c0;
    local_18b4 = local_18c0;
    local_18b0 = local_18c0;
    local_18ac = local_18c0;
    local_18a8 = local_18c0;
    local_18a4 = local_18c0;
    local_187c = local_1880;
    local_1878 = local_1880;
    local_1874 = local_1880;
    local_1870 = local_1880;
    local_186c = local_1880;
    local_1868 = local_1880;
    local_1864 = local_1880;
    local_183c = local_1840;
    local_1838 = local_1840;
    local_1834 = local_1840;
    local_1830 = local_1840;
    local_182c = local_1840;
    local_1828 = local_1840;
    local_1824 = local_1840;
    local_17fc = local_1800;
    local_17f8 = local_1800;
    local_17f4 = local_1800;
    local_17f0 = local_1800;
    local_17ec = local_1800;
    local_17e8 = local_1800;
    local_17e4 = local_1800;
    local_17bc = local_17c0;
    local_17b8 = local_17c0;
    local_17b4 = local_17c0;
    local_17b0 = local_17c0;
    local_17ac = local_17c0;
    local_17a8 = local_17c0;
    local_17a4 = local_17c0;
    local_177c = local_1780;
    local_1778 = local_1780;
    local_1774 = local_1780;
    local_1770 = local_1780;
    local_176c = local_1780;
    local_1768 = local_1780;
    local_1764 = local_1780;
    local_173c = local_1740;
    local_1738 = local_1740;
    local_1734 = local_1740;
    local_1730 = local_1740;
    local_172c = local_1740;
    local_1728 = local_1740;
    local_1724 = local_1740;
    local_16fc = local_1700;
    local_16f8 = local_1700;
    local_16f4 = local_1700;
    local_16f0 = local_1700;
    local_16ec = local_1700;
    local_16e8 = local_1700;
    local_16e4 = local_1700;
    local_16bc = local_16c0;
    local_16b8 = local_16c0;
    local_16b4 = local_16c0;
    local_16b0 = local_16c0;
    local_16ac = local_16c0;
    local_16a8 = local_16c0;
    local_16a4 = local_16c0;
    local_167c = local_1680;
    local_1678 = local_1680;
    local_1674 = local_1680;
    local_1670 = local_1680;
    local_166c = local_1680;
    local_1668 = local_1680;
    local_1664 = local_1680;
    local_1600 = local_1620;
    uStack_15f8 = uStack_1618;
    uStack_15f0 = uStack_1610;
    uStack_15e8 = uStack_1608;
    local_15c0 = local_15e0;
    uStack_15b8 = uStack_15d8;
    uStack_15b0 = uStack_15d0;
    uStack_15a8 = uStack_15c8;
    fStack_1504 = fStack_1cc4;
    local_14a0 = local_18a0._0_8_;
    uStack_1498 = local_18a0._8_8_;
    uStack_1490 = auStack_1890._0_8_;
    uStack_1488 = auStack_1890._8_8_;
    fStack_1464 = fStack_1d44;
    local_1408 = local_14a8;
    local_1400 = local_1820._0_8_;
    uStack_13f8 = local_1820._8_8_;
    uStack_13f0 = auStack_1810._0_8_;
    uStack_13e8 = auStack_1810._8_8_;
    fStack_13c4 = fStack_1d64;
    local_1368 = local_14a8;
    local_1360 = local_17a0._0_8_;
    uStack_1358 = local_17a0._8_8_;
    uStack_1350 = auStack_1790._0_8_;
    uStack_1348 = auStack_1790._8_8_;
    fStack_1324 = fStack_1d84;
    local_12c8 = local_14a8;
    local_12c0 = local_1720._0_8_;
    uStack_12b8 = local_1720._8_8_;
    uStack_12b0 = auStack_1710._0_8_;
    uStack_12a8 = auStack_1710._8_8_;
    local_1280 = local_16a0._0_8_;
    uStack_1278 = local_16a0._8_8_;
    uStack_1270 = auStack_1690._0_8_;
    uStack_1268 = auStack_1690._8_8_;
    local_1228 = local_14a8;
    local_1220 = local_1860._0_8_;
    uStack_1218 = local_1860._8_8_;
    uStack_1210 = auStack_1850._0_8_;
    uStack_1208 = auStack_1850._8_8_;
    fStack_11e4 = fStack_1ce4;
    local_1188 = local_14a8;
    local_1180 = local_17e0._0_8_;
    uStack_1178 = local_17e0._8_8_;
    uStack_1170 = auStack_17d0._0_8_;
    uStack_1168 = auStack_17d0._8_8_;
    fStack_1144 = fStack_1d04;
    local_10e8 = local_14a8;
    local_10e0 = local_1760._0_8_;
    uStack_10d8 = local_1760._8_8_;
    uStack_10d0 = auStack_1750._0_8_;
    uStack_10c8 = auStack_1750._8_8_;
    local_10a0 = local_16e0._0_8_;
    uStack_1098 = local_16e0._8_8_;
    uStack_1090 = auStack_16d0._0_8_;
    uStack_1088 = auStack_16d0._8_8_;
    local_dc0 = local_23e0._0_8_;
    uStack_db8 = local_23e0._8_8_;
    uStack_db0 = local_23e0._16_8_;
    uStack_da8 = local_23e0._24_8_;
  }
  for (; local_25ac = in_ECX, local_25bc + 3 < in_ECX; local_25bc = local_25bc + 4) {
    local_2550 = local_25a0;
    local_2650 = *(undefined8 *)*local_25a0;
    uStack_2648 = *(undefined8 *)(*local_25a0 + 8);
    local_24c0 = local_25b1;
    local_24c8 = &local_25d0;
    local_24d0 = &local_2650;
    local_c40 = local_2670;
    uStack_c38 = uStack_2668;
    auVar43._8_8_ = uStack_2668;
    auVar43._0_8_ = local_2670;
    auVar42._8_8_ = uStack_2668;
    auVar42._0_8_ = local_2670;
    auVar41._8_8_ = uStack_2668;
    auVar41._0_8_ = local_2670;
    auVar40._8_8_ = uStack_2668;
    auVar40._0_8_ = local_2670;
    local_964 = 0;
    local_944 = 0;
    local_960 = 0;
    local_c60 = 0;
    uStack_c58 = 0;
    local_984 = 0x80000000;
    local_968 = 0x80000000;
    local_980 = 0x80000000;
    local_c70 = 0x8000000080000000;
    uStack_c68 = 0x8000000080000000;
    local_9a4 = 0x40490fdb;
    local_988 = 0x40490fdb;
    local_9a0 = 0x40490fdb;
    local_c80 = 0x40490fdb40490fdb;
    uStack_c78 = 0x40490fdb40490fdb;
    local_9c4 = 0x3fc90fdb;
    local_9a8 = 0x3fc90fdb;
    local_9c0 = 0x3fc90fdb;
    local_c90 = 0x3fc90fdb3fc90fdb;
    uStack_c88 = 0x3fc90fdb3fc90fdb;
    local_ca0 = vcmpps_avx(*(undefined1 (*) [16])*local_25a0,ZEXT816(0),4);
    local_cb0 = vcmpps_avx(auVar40,ZEXT816(0),4);
    local_b00 = local_ca0._0_8_;
    uStack_af8 = local_ca0._8_8_;
    local_b10 = local_cb0._0_8_;
    uStack_b08 = local_cb0._8_8_;
    local_cc0 = vpand_avx(local_ca0,local_cb0);
    auVar25._8_8_ = 0x8000000080000000;
    auVar25._0_8_ = 0x8000000080000000;
    local_cd0 = vpand_avx(auVar25,*(undefined1 (*) [16])*local_25a0);
    auVar24._8_8_ = 0x8000000080000000;
    auVar24._0_8_ = 0x8000000080000000;
    local_ce0 = vpand_avx(auVar24,auVar41);
    local_b80 = vcmpps_avx(*(undefined1 (*) [16])*local_25a0,ZEXT816(0),1);
    local_b60 = vcmpps_avx(auVar42,ZEXT816(0),1);
    auVar2._8_8_ = 0x8000000080000000;
    auVar2._0_8_ = 0x8000000080000000;
    local_a40 = vpand_avx(local_b60,auVar2);
    auVar28._8_8_ = 0x40490fdb40490fdb;
    auVar28._0_8_ = 0x40490fdb40490fdb;
    local_b90 = vpor_avx(local_a40,auVar28);
    local_cf0 = vpand_avx(local_b80,local_b90);
    local_750 = vdivps_avx(auVar43,*(undefined1 (*) [16])*local_25a0);
    local_114 = 0x80000000;
    local_f4 = 0x80000000;
    local_110 = 0x80000000;
    local_760 = 0x8000000080000000;
    uStack_758 = 0x8000000080000000;
    local_134 = 0x3f800000;
    local_118 = 0x3f800000;
    local_130 = 0x3f800000;
    local_770 = 0x3f8000003f800000;
    uStack_768 = 0x3f8000003f800000;
    local_154 = 0xbf800000;
    local_138 = 0xbf800000;
    local_150 = 0xbf800000;
    local_780 = 0xbf800000bf800000;
    uStack_778 = 0xbf800000bf800000;
    local_174 = 0x3fc90fdb;
    local_158 = 0x3fc90fdb;
    local_170 = 0x3fc90fdb;
    local_790 = 0x3fc90fdb3fc90fdb;
    uStack_788 = 0x3fc90fdb3fc90fdb;
    local_194 = 0x3f800000;
    local_178 = 0x3f800000;
    local_190 = 0x3f800000;
    local_7a0 = 0x3f8000003f800000;
    uStack_798 = 0x3f8000003f800000;
    local_1b4 = 0xbeaaaa53;
    local_198 = 0xbeaaaa53;
    local_1b0 = 0xbeaaaa53;
    local_7b0 = 0xbeaaaa53beaaaa53;
    uStack_7a8 = 0xbeaaaa53beaaaa53;
    local_1d4 = 0x3e4cb974;
    local_1b8 = 0x3e4cb974;
    local_1d0 = 0x3e4cb974;
    local_7c0 = 0x3e4cb9743e4cb974;
    uStack_7b8 = 0x3e4cb9743e4cb974;
    local_1f4 = 0xbe117200;
    local_1d8 = 0xbe117200;
    local_1f0 = 0xbe117200;
    local_7d0 = 0xbe117200be117200;
    uStack_7c8 = 0xbe117200be117200;
    local_214 = 0x3dd9ed24;
    local_1f8 = 0x3dd9ed24;
    local_210 = 0x3dd9ed24;
    local_7e0 = 0x3dd9ed243dd9ed24;
    uStack_7d8 = 0x3dd9ed243dd9ed24;
    local_234 = 0xbd99b01e;
    local_218 = 0xbd99b01e;
    local_230 = 0xbd99b01e;
    local_7f0 = 0xbd99b01ebd99b01e;
    uStack_7e8 = 0xbd99b01ebd99b01e;
    local_254 = 0x3d2edd4e;
    local_238 = 0x3d2edd4e;
    local_250 = 0x3d2edd4e;
    local_800 = 0x3d2edd4e3d2edd4e;
    uStack_7f8 = 0x3d2edd4e3d2edd4e;
    local_274 = 0xbc83a25c;
    local_258 = 0xbc83a25c;
    local_270 = 0xbc83a25c;
    local_810 = 0xbc83a25cbc83a25c;
    uStack_808 = 0xbc83a25cbc83a25c;
    local_294 = 0x3b3ac537;
    local_278 = 0x3b3ac537;
    local_290 = 0x3b3ac537;
    local_820 = 0x3b3ac5373b3ac537;
    uStack_818 = 0x3b3ac5373b3ac537;
    local_640 = local_750._0_8_;
    uStack_638 = local_750._8_8_;
    auVar31._8_8_ = 0x8000000080000000;
    auVar31._0_8_ = 0x8000000080000000;
    local_830 = vpand_avx(auVar31,local_750);
    local_b0 = local_750._0_8_;
    uStack_a8 = local_750._8_8_;
    auVar35._8_8_ = 0x8000000080000000;
    auVar35._0_8_ = 0x8000000080000000;
    auVar2 = vpcmpeqd_avx(auVar28,auVar28);
    local_840 = vpandn_avx(auVar35,local_750);
    local_2c0 = local_840._0_8_;
    uStack_2b8 = local_840._8_8_;
    auVar33._8_8_ = 0x3f8000003f800000;
    auVar33._0_8_ = 0x3f8000003f800000;
    local_850 = vcmpps_avx(auVar33,local_840,1);
    local_650 = local_850._0_8_;
    uStack_648 = local_850._8_8_;
    auVar30._8_8_ = 0xbf800000bf800000;
    auVar30._0_8_ = 0xbf800000bf800000;
    local_2d0 = vpand_avx(local_850,auVar30);
    local_c0 = local_850._0_8_;
    uStack_b8 = local_850._8_8_;
    local_d0 = local_840._0_8_;
    uStack_c8 = local_840._8_8_;
    local_2e0 = vpandn_avx(local_850,local_840);
    local_6b0 = vpor_avx(local_2d0,local_2e0);
    local_670 = local_850._0_8_;
    uStack_668 = local_850._8_8_;
    local_680 = local_840._0_8_;
    uStack_678 = local_840._8_8_;
    local_2f0 = vpand_avx(local_850,local_840);
    local_e0 = local_850._0_8_;
    uStack_d8 = local_850._8_8_;
    auVar34._8_8_ = 0x3f8000003f800000;
    auVar34._0_8_ = 0x3f8000003f800000;
    local_300 = vpandn_avx(local_850,auVar34);
    local_6c0 = vpor_avx(local_2f0,local_300);
    local_860 = vdivps_avx(local_6b0,local_6c0);
    local_6e0 = local_860._0_8_;
    uStack_6d8 = local_860._8_8_;
    local_6d0._0_4_ = local_860._0_4_;
    local_6d0._4_4_ = local_860._4_4_;
    uStack_6c8._0_4_ = local_860._8_4_;
    uStack_6c8._4_4_ = local_860._12_4_;
    local_870 = (float)local_6d0 * (float)local_6d0;
    fStack_86c = local_6d0._4_4_ * local_6d0._4_4_;
    fStack_868 = (float)uStack_6c8 * (float)uStack_6c8;
    fStack_864 = uStack_6c8._4_4_ * uStack_6c8._4_4_;
    local_700 = CONCAT44(fStack_86c,local_870);
    uStack_6f8 = CONCAT44(fStack_864,fStack_868);
    local_880 = local_870 * local_870;
    fStack_87c = fStack_86c * fStack_86c;
    fStack_878 = fStack_868 * fStack_868;
    fStack_874 = fStack_864 * fStack_864;
    local_5a8 = &local_880;
    local_370 = &local_810;
    local_378 = &local_7f0;
    local_330 = CONCAT44(fStack_87c,local_880);
    uStack_328 = CONCAT44(fStack_874,fStack_878);
    local_340 = 0xbc83a25cbc83a25c;
    uStack_338 = 0xbc83a25cbc83a25c;
    local_350 = local_880 * -0.01606863;
    fStack_34c = fStack_87c * -0.01606863;
    fStack_348 = fStack_878 * -0.01606863;
    fStack_344 = fStack_874 * -0.01606863;
    local_360 = 0xbd99b01ebd99b01e;
    uStack_358 = 0xbd99b01ebd99b01e;
    local_8c0 = local_350 + -0.07504295;
    fStack_8bc = fStack_34c + -0.07504295;
    fStack_8b8 = fStack_348 + -0.07504295;
    fStack_8b4 = fStack_344 + -0.07504295;
    local_3d0 = &local_8c0;
    local_3d8 = &local_7d0;
    local_390 = CONCAT44(fStack_87c,local_880);
    uStack_388 = CONCAT44(fStack_874,fStack_878);
    local_3a0 = CONCAT44(fStack_8bc,local_8c0);
    uStack_398 = CONCAT44(fStack_8b4,fStack_8b8);
    local_3b0 = local_880 * local_8c0;
    fStack_3ac = fStack_87c * fStack_8bc;
    fStack_3a8 = fStack_878 * fStack_8b8;
    fStack_3a4 = fStack_874 * fStack_8b4;
    local_3c0 = 0xbe117200be117200;
    uStack_3b8 = 0xbe117200be117200;
    local_8b0 = local_3b0 + -0.14203644;
    fStack_8ac = fStack_3ac + -0.14203644;
    fStack_8a8 = fStack_3a8 + -0.14203644;
    fStack_8a4 = fStack_3a4 + -0.14203644;
    local_430 = &local_8b0;
    local_438 = &local_7b0;
    local_3f0 = CONCAT44(fStack_87c,local_880);
    uStack_3e8 = CONCAT44(fStack_874,fStack_878);
    local_400 = CONCAT44(fStack_8ac,local_8b0);
    uStack_3f8 = CONCAT44(fStack_8a4,fStack_8a8);
    local_410 = local_880 * local_8b0;
    fStack_40c = fStack_87c * fStack_8ac;
    fStack_408 = fStack_878 * fStack_8a8;
    fStack_404 = fStack_874 * fStack_8a4;
    local_420 = 0xbeaaaa53beaaaa53;
    uStack_418 = 0xbeaaaa53beaaaa53;
    local_8a0 = local_410 + -0.33333072;
    fStack_89c = fStack_40c + -0.33333072;
    fStack_898 = fStack_408 + -0.33333072;
    fStack_894 = fStack_404 + -0.33333072;
    local_490 = &local_820;
    local_498 = &local_800;
    local_450 = CONCAT44(fStack_87c,local_880);
    uStack_448 = CONCAT44(fStack_874,fStack_878);
    local_460 = 0x3b3ac5373b3ac537;
    uStack_458 = 0x3b3ac5373b3ac537;
    local_470 = local_880 * 0.0028498897;
    fStack_46c = fStack_87c * 0.0028498897;
    fStack_468 = fStack_878 * 0.0028498897;
    fStack_464 = fStack_874 * 0.0028498897;
    local_480 = 0x3d2edd4e3d2edd4e;
    uStack_478 = 0x3d2edd4e3d2edd4e;
    local_900 = local_470 + 0.04269152;
    fStack_8fc = fStack_46c + 0.04269152;
    fStack_8f8 = fStack_468 + 0.04269152;
    fStack_8f4 = fStack_464 + 0.04269152;
    local_4f0 = &local_900;
    local_4f8 = &local_7e0;
    local_4b0 = CONCAT44(fStack_87c,local_880);
    uStack_4a8 = CONCAT44(fStack_874,fStack_878);
    local_4c0 = CONCAT44(fStack_8fc,local_900);
    uStack_4b8 = CONCAT44(fStack_8f4,fStack_8f8);
    local_4d0 = local_880 * local_900;
    fStack_4cc = fStack_87c * fStack_8fc;
    fStack_4c8 = fStack_878 * fStack_8f8;
    fStack_4c4 = fStack_874 * fStack_8f4;
    local_4e0 = 0x3dd9ed243dd9ed24;
    uStack_4d8 = 0x3dd9ed243dd9ed24;
    local_8f0 = local_4d0 + 0.10640934;
    fStack_8ec = fStack_4cc + 0.10640934;
    fStack_8e8 = fStack_4c8 + 0.10640934;
    fStack_8e4 = fStack_4c4 + 0.10640934;
    local_550 = &local_8f0;
    local_558 = &local_7c0;
    local_510 = CONCAT44(fStack_87c,local_880);
    uStack_508 = CONCAT44(fStack_874,fStack_878);
    local_520 = CONCAT44(fStack_8ec,local_8f0);
    uStack_518 = CONCAT44(fStack_8e4,fStack_8e8);
    local_530 = local_880 * local_8f0;
    fStack_52c = fStack_87c * fStack_8ec;
    fStack_528 = fStack_878 * fStack_8e8;
    fStack_524 = fStack_874 * fStack_8e4;
    local_540 = 0x3e4cb9743e4cb974;
    uStack_538 = 0x3e4cb9743e4cb974;
    local_8e0 = local_530 + 0.1999262;
    fStack_8dc = fStack_52c + 0.1999262;
    fStack_8d8 = fStack_528 + 0.1999262;
    fStack_8d4 = fStack_524 + 0.1999262;
    local_5b0 = &local_8e0;
    local_5b8 = &local_7a0;
    local_570 = CONCAT44(fStack_87c,local_880);
    uStack_568 = CONCAT44(fStack_874,fStack_878);
    local_580 = CONCAT44(fStack_8dc,local_8e0);
    uStack_578 = CONCAT44(fStack_8d4,fStack_8d8);
    local_590 = local_880 * local_8e0;
    fStack_58c = fStack_87c * fStack_8dc;
    fStack_588 = fStack_878 * fStack_8d8;
    fStack_584 = fStack_874 * fStack_8d4;
    local_5a0 = 0x3f8000003f800000;
    uStack_598 = 0x3f8000003f800000;
    local_8d0 = local_590 + 1.0;
    fStack_8cc = fStack_58c + 1.0;
    fStack_8c8 = fStack_588 + 1.0;
    fStack_8c4 = fStack_584 + 1.0;
    local_608 = &local_870;
    local_610 = &local_8a0;
    local_618 = &local_8d0;
    local_5d0 = CONCAT44(fStack_86c,local_870);
    uStack_5c8 = CONCAT44(fStack_864,fStack_868);
    local_5e0 = CONCAT44(fStack_89c,local_8a0);
    uStack_5d8 = CONCAT44(fStack_894,fStack_898);
    local_5f0 = local_870 * local_8a0;
    fStack_5ec = fStack_86c * fStack_89c;
    fStack_5e8 = fStack_868 * fStack_898;
    fStack_5e4 = fStack_864 * fStack_894;
    local_600 = CONCAT44(fStack_8cc,local_8d0);
    uStack_5f8 = CONCAT44(fStack_8c4,fStack_8c8);
    local_890 = local_5f0 + local_8d0;
    fStack_88c = fStack_5ec + fStack_8cc;
    fStack_888 = fStack_5e8 + fStack_8c8;
    fStack_884 = fStack_5e4 + fStack_8c4;
    local_710 = CONCAT44(fStack_88c,local_890);
    uStack_708 = CONCAT44(fStack_884,fStack_888);
    local_720 = local_860._0_8_;
    uStack_718 = local_860._8_8_;
    local_730 = local_890 * (float)local_6d0;
    fStack_72c = fStack_88c * local_6d0._4_4_;
    fStack_728 = fStack_888 * (float)uStack_6c8;
    fStack_724 = fStack_884 * uStack_6c8._4_4_;
    local_690 = local_850._0_8_;
    uStack_688 = local_850._8_8_;
    auVar29._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar29._0_8_ = 0x3fc90fdb3fc90fdb;
    _local_740 = vpand_avx(local_850,auVar29);
    local_310 = local_730 + (float)local_740._0_4_;
    fStack_30c = fStack_72c + (float)local_740._4_4_;
    fStack_308 = fStack_728 + fStack_738;
    fStack_304 = fStack_724 + fStack_734;
    local_320 = local_830._0_8_;
    uStack_318 = local_830._8_8_;
    auVar32._4_4_ = fStack_30c;
    auVar32._0_4_ = local_310;
    auVar32._8_4_ = fStack_308;
    auVar32._12_4_ = fStack_304;
    _local_c20 = vpor_avx(auVar32,local_830);
    local_c30._0_4_ = local_cf0._0_4_;
    local_c30._4_4_ = local_cf0._4_4_;
    uStack_c28._0_4_ = local_cf0._8_4_;
    uStack_c28._4_4_ = local_cf0._12_4_;
    local_d00 = (float)local_c20._0_4_ + (float)local_c30;
    fStack_cfc = (float)local_c20._4_4_ + local_c30._4_4_;
    fStack_cf8 = fStack_c18 + (float)uStack_c28;
    fStack_cf4 = fStack_c14 + uStack_c28._4_4_;
    local_a60 = local_cd0._0_8_;
    uStack_a58 = local_cd0._8_8_;
    auVar27._8_8_ = 0x40490fdb40490fdb;
    auVar27._0_8_ = 0x40490fdb40490fdb;
    local_a20 = vpor_avx(local_cd0,auVar27);
    local_d10 = vcmpps_avx(local_a20,ZEXT816(0),1);
    local_ba0 = local_cb0._0_8_;
    uStack_b98 = local_cb0._8_8_;
    local_a80 = local_ce0._0_8_;
    uStack_a78 = local_ce0._8_8_;
    auVar26._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar26._0_8_ = 0x3fc90fdb3fc90fdb;
    local_bb0 = vpor_avx(local_ce0,auVar26);
    local_ac0 = vpand_avx(local_cb0,local_bb0);
    local_60 = local_cb0._0_8_;
    uStack_58 = local_cb0._8_8_;
    local_bc0 = local_d10._0_8_;
    uStack_bb8 = local_d10._8_8_;
    auVar23._8_8_ = 0x40490fdb40490fdb;
    auVar23._0_8_ = 0x40490fdb40490fdb;
    local_aa0 = vpand_avx(local_d10,auVar23);
    local_40 = local_d10._0_8_;
    uStack_38 = local_d10._8_8_;
    local_ab0 = vpandn_avx(local_d10,ZEXT816(0));
    local_70 = vpor_avx(local_aa0,local_ab0);
    local_ad0 = vpandn_avx(local_cb0,local_70);
    local_d20 = vpor_avx(local_ac0,local_ad0);
    local_be0 = local_cc0._0_8_;
    uStack_bd8 = local_cc0._8_8_;
    local_bf0 = CONCAT44(fStack_cfc,local_d00);
    uStack_be8 = CONCAT44(fStack_cf4,fStack_cf8);
    auVar22._8_8_ = uStack_be8;
    auVar22._0_8_ = local_bf0;
    local_ae0 = vpand_avx(local_cc0,auVar22);
    local_80 = local_cc0._0_8_;
    uStack_78 = local_cc0._8_8_;
    local_90 = local_d20._0_8_;
    uStack_88 = local_d20._8_8_;
    local_af0 = vpand_avx(local_cc0 ^ auVar2,local_d20);
    auVar2 = vpor_avx(local_ae0,local_af0);
    local_2528 = local_25a8;
    local_2660 = auVar2._0_8_;
    local_2540 = local_2660;
    uStack_2658 = auVar2._8_8_;
    uStack_2538 = uStack_2658;
    *(undefined8 *)local_25a8 = local_2660;
    *(undefined8 *)(local_25a8 + 2) = uStack_2658;
    local_25a0 = (undefined1 (*) [32])(*local_25a0 + 0x10);
    local_25a8 = local_25a8 + 4;
    local_c50 = local_2650;
    uStack_c48 = uStack_2648;
    local_c30 = local_cf0._0_8_;
    uStack_c28 = local_cf0._8_8_;
    local_c10 = local_2650;
    uStack_c08 = uStack_2648;
    local_c00 = local_c40;
    uStack_bf8 = uStack_c38;
    local_bd0 = local_c80;
    uStack_bc8 = uStack_c78;
    local_b70 = local_c70;
    uStack_b68 = uStack_c68;
    local_b50 = local_c40;
    uStack_b48 = uStack_c38;
    local_b40 = local_c70;
    uStack_b38 = uStack_c68;
    local_b30 = local_2650;
    uStack_b28 = uStack_2648;
    local_b20 = local_c70;
    uStack_b18 = uStack_c68;
    local_a90 = local_c90;
    uStack_a88 = uStack_c88;
    local_a70 = local_c80;
    uStack_a68 = uStack_c78;
    local_a50 = local_c80;
    uStack_a48 = uStack_c78;
    local_a30 = local_c60;
    uStack_a28 = uStack_c58;
    local_a10 = local_c60;
    uStack_a08 = uStack_c58;
    local_a00 = local_c40;
    uStack_9f8 = uStack_c38;
    local_9f0 = local_c60;
    uStack_9e8 = uStack_c58;
    local_9e0 = local_2650;
    uStack_9d8 = uStack_2648;
    uStack_9bc = local_9c0;
    uStack_9b8 = local_9c0;
    uStack_9b4 = local_9c0;
    uStack_99c = local_9a0;
    uStack_998 = local_9a0;
    uStack_994 = local_9a0;
    uStack_97c = local_980;
    uStack_978 = local_980;
    uStack_974 = local_980;
    uStack_95c = local_960;
    uStack_958 = local_960;
    uStack_954 = local_960;
    local_940 = local_c60;
    uStack_938 = uStack_c58;
    local_930 = local_c40;
    uStack_928 = uStack_c38;
    local_920 = local_c60;
    uStack_918 = uStack_c58;
    local_910 = local_2650;
    uStack_908 = uStack_2648;
    local_6f0 = local_700;
    uStack_6e8 = uStack_6f8;
    local_6d0 = local_6e0;
    uStack_6c8 = uStack_6d8;
    local_6a0 = local_790;
    uStack_698 = uStack_788;
    local_660 = local_780;
    uStack_658 = uStack_778;
    local_630 = local_760;
    uStack_628 = uStack_758;
    local_548 = local_5a8;
    local_4e8 = local_5a8;
    local_488 = local_5a8;
    local_428 = local_5a8;
    local_3c8 = local_5a8;
    local_368 = local_5a8;
    local_2b0 = local_770;
    uStack_2a8 = uStack_768;
    uStack_28c = local_290;
    uStack_288 = local_290;
    uStack_284 = local_290;
    uStack_26c = local_270;
    uStack_268 = local_270;
    uStack_264 = local_270;
    uStack_24c = local_250;
    uStack_248 = local_250;
    uStack_244 = local_250;
    uStack_22c = local_230;
    uStack_228 = local_230;
    uStack_224 = local_230;
    uStack_20c = local_210;
    uStack_208 = local_210;
    uStack_204 = local_210;
    uStack_1ec = local_1f0;
    uStack_1e8 = local_1f0;
    uStack_1e4 = local_1f0;
    uStack_1cc = local_1d0;
    uStack_1c8 = local_1d0;
    uStack_1c4 = local_1d0;
    uStack_1ac = local_1b0;
    uStack_1a8 = local_1b0;
    uStack_1a4 = local_1b0;
    uStack_18c = local_190;
    uStack_188 = local_190;
    uStack_184 = local_190;
    uStack_16c = local_170;
    uStack_168 = local_170;
    uStack_164 = local_170;
    uStack_14c = local_150;
    uStack_148 = local_150;
    uStack_144 = local_150;
    uStack_12c = local_130;
    uStack_128 = local_130;
    uStack_124 = local_130;
    uStack_10c = local_110;
    uStack_108 = local_110;
    uStack_104 = local_110;
    local_f0 = local_770;
    uStack_e8 = uStack_768;
    local_a0 = local_760;
    uStack_98 = uStack_758;
    local_50 = local_c60;
    uStack_48 = uStack_c58;
  }
  for (; local_25bc < local_25ac; local_25bc = local_25bc + 1) {
    local_24a8 = local_25b1;
    local_24b0 = &local_25b8;
    local_24b8 = local_25a0;
    fVar44 = atan2f(local_25b8,*(float *)*local_25a0);
    *local_25a8 = fVar44;
    local_25a0 = (undefined1 (*) [32])(*local_25a0 + 4);
    local_25a8 = local_25a8 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_a(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float a = *ptr;

    int i = 0;
#if __SSE2__
    __m128 _a_128 = (elempack == 4) ? _mm_loadu_ps(ptr) : _mm_set1_ps(a);
#if __AVX__
    __m256 _a_256 = (elempack == 8) ? _mm256_loadu_ps(ptr) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a_128), _a_128, 1);
#if __AVX512F__
    __m512 _a_512 = (elempack == 16) ? _mm512_loadu_ps(ptr) : _mm512_insertf32x8(_mm512_castps256_ps512(_a_256), _a_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_a_512, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_a_256, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_a_128, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(a, *ptr1);
        ptr1 += 1;
        outptr += 1;
    }
}